

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O1

void __thiscall
Assimp::AMFImporter::Postprocess_BuildMeshSet
          (AMFImporter *this,CAMFImporter_NodeElement_Mesh *pNodeElement,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pVertexCoordinateArray,
          vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
          *pVertexColorArray,CAMFImporter_NodeElement_Color *pObjectColor,
          list<aiMesh_*,_std::allocator<aiMesh_*>_> *pMeshList,aiNode *pSceneNode)

{
  size_t *psVar1;
  aiVector3t<float> *paVar2;
  float *pfVar3;
  _Base_ptr p_Var4;
  pointer paVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 *******pppppppuVar8;
  size_t __n;
  float fVar9;
  float fVar10;
  float fVar11;
  list<aiMesh_*,_std::allocator<aiMesh_*>_> *plVar12;
  bool bVar13;
  _Node *p_Var14;
  _List_node_base *p_Var15;
  ulong *puVar16;
  _List_node_base *p_Var17;
  aiColor4t<float> *paVar18;
  void *__s;
  size_t sVar19;
  _List_node_base *p_Var20;
  uint *puVar21;
  runtime_error *this_00;
  _Base_ptr p_Var22;
  _List_node_base *p_Var23;
  aiColor4t<float> *paVar24;
  size_t *psVar25;
  ulong uVar26;
  aiColor4t<float> *paVar27;
  ulong uVar28;
  long *plVar29;
  CAMFImporter_NodeElement_Color ***pppCVar30;
  ulong uVar31;
  aiColor4t<float> *paVar32;
  aiColor4t<float> *paVar33;
  const_iterator mit;
  long lVar34;
  undefined8 *******pppppppuVar35;
  int iVar36;
  CAMFImporter_NodeElement_Triangle *tri_al;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vert_arr;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> col_arr;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> texcoord_arr;
  list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
  complex_faces_toplist;
  list<unsigned_int,_std::allocator<unsigned_int>_> mesh_idx;
  anon_class_40_5_b0e7ad54 Vertex_CalculateColor;
  list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
  complex_faces_list;
  SPP_Material *cur_mat;
  CAMFImporter_NodeElement_Color *ne_volume_color;
  aiColor4D face_color;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_188;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> local_168;
  _List_node_base *local_150;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_148;
  _List_node_base *local_128;
  AMFImporter *local_120;
  _List_node_base *local_118;
  _List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
  local_110;
  undefined8 *******local_f8;
  undefined8 *******local_f0;
  ulong local_e8;
  anon_class_40_5_b0e7ad54 local_e0;
  list<aiMesh_*,_std::allocator<aiMesh_*>_> *local_b8;
  undefined1 local_b0 [16];
  size_t local_a0;
  CAMFImporter_NodeElement_Color *local_98;
  undefined1 local_90 [8];
  aiColor4D local_88;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  _List_node_base *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Alloc_hider local_40;
  CAMFImporter_NodeElement_Color *local_38;
  
  local_f8 = &local_f8;
  local_e8 = 0;
  p_Var20 = (pNodeElement->super_CAMFImporter_NodeElement).Child.
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  local_50._M_allocated_capacity = (size_type)&(pNodeElement->super_CAMFImporter_NodeElement).Child;
  local_120 = this;
  local_f0 = local_f8;
  local_b8 = pMeshList;
  uVar7 = pVertexCoordinateArray;
  local_40._M_p = (pointer)pVertexColorArray;
  local_38 = pObjectColor;
  if (p_Var20 != (_List_node_base *)local_50._M_allocated_capacity) {
    do {
      local_50._8_8_ = uVar7;
      p_Var15 = p_Var20[1]._M_next;
      local_90 = (undefined1  [8])0x0;
      local_98 = (CAMFImporter_NodeElement_Color *)0x0;
      if (*(int *)&p_Var15->_M_prev == 0xf) {
        local_b0._0_8_ = local_b0;
        local_a0 = 0;
        local_110._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_110;
        local_110._M_impl._M_node._M_size = 0;
        local_110._M_impl._M_node.super__List_node_base._M_prev =
             local_110._M_impl._M_node.super__List_node_base._M_next;
        local_b0._8_8_ = local_b0._0_8_;
        local_58 = p_Var20;
        if (*(_List_node_base **)((long)(p_Var15 + 5) + 8) != (_List_node_base *)0x0) {
          this = local_120;
          bVar13 = Find_ConvertedMaterial
                             (local_120,(string *)(p_Var15 + 5),(SPP_Material **)&local_98);
          if (!bVar13) {
            this = local_120;
            Throw_ID_NotFound(local_120,(string *)(p_Var15 + 5));
          }
        }
        for (p_Var20 = *(_List_node_base **)((long)(p_Var15 + 3) + 8);
            p_Var20 != (_List_node_base *)((long)(p_Var15 + 3) + 8U); p_Var20 = p_Var20->_M_next) {
          p_Var4 = (_Base_ptr)p_Var20[1]._M_next;
          if (*(int *)&p_Var4->_M_parent == 10) {
            local_e0.ne_volume_color = (CAMFImporter_NodeElement_Color **)0x0;
            local_e0.pObjectColor = (CAMFImporter_NodeElement_Color **)0x0;
            local_e0.cur_mat = (SPP_Material **)0x0;
            if (p_Var4[2]._M_parent != (_Base_ptr)0x0) {
              for (p_Var22 = p_Var4[1]._M_right; p_Var22 != (_Base_ptr)&p_Var4[1]._M_right;
                  p_Var22 = *(_Base_ptr *)p_Var22) {
                iVar36 = *(int *)&p_Var22->_M_left->_M_parent;
                pppCVar30 = &local_e0.pObjectColor;
                if (iVar36 == 0) {
LAB_003f5979:
                  *pppCVar30 = (CAMFImporter_NodeElement_Color **)p_Var22->_M_left;
                }
                else if (iVar36 == 0xb) {
                  pppCVar30 = (CAMFImporter_NodeElement_Color ***)&local_e0.cur_mat;
                  goto LAB_003f5979;
                }
              }
            }
            local_e0.pVertexColorArray =
                 (vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
                  *)CONCAT44(local_e0.pVertexColorArray._4_4_,3);
            local_e0.ne_volume_color = (CAMFImporter_NodeElement_Color **)operator_new__(0xc);
            *(undefined4 *)
             &(((AMFImporter *)local_e0.ne_volume_color)->super_BaseImporter)._vptr_BaseImporter =
                 *(undefined4 *)&p_Var4[2]._M_left;
            *(undefined4 *)
             ((long)&(((AMFImporter *)local_e0.ne_volume_color)->super_BaseImporter).
                     _vptr_BaseImporter + 4) = *(undefined4 *)&p_Var4[2]._M_right;
            *(_Rb_tree_color *)
             &(((AMFImporter *)local_e0.ne_volume_color)->super_BaseImporter).importerUnits._M_t.
              _M_impl = p_Var4[3]._M_color;
            p_Var14 = std::__cxx11::
                      list<Assimp::AMFImporter::SComplexFace,std::allocator<Assimp::AMFImporter::SComplexFace>>
                      ::_M_create_node<Assimp::AMFImporter::SComplexFace_const&>
                                ((list<Assimp::AMFImporter::SComplexFace,std::allocator<Assimp::AMFImporter::SComplexFace>>
                                  *)local_b0,(SComplexFace *)&local_e0);
            std::__detail::_List_node_base::_M_hook(&p_Var14->super__List_node_base);
            local_a0 = local_a0 + 1;
            this = (AMFImporter *)local_e0.ne_volume_color;
            if ((AMFImporter *)local_e0.ne_volume_color != (AMFImporter *)0x0) {
              operator_delete__(local_e0.ne_volume_color);
            }
          }
          else if (*(int *)&p_Var4->_M_parent == 0) {
            local_90 = (undefined1  [8])p_Var4;
          }
        }
        PostprocessHelper_SplitFacesByTextureID
                  (this,(list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                         *)local_b0,
                   (list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
                    *)&local_110);
        for (local_128 = local_110._M_impl._M_node.super__List_node_base._M_next;
            local_128 != (_List_node_base *)&local_110;
            local_128 = (((_List_impl *)&local_128->_M_next)->_M_node).super__List_node_base._M_next
            ) {
          local_e0.pVertexColorArray =
               (vector<CAMFImporter_NodeElement_Color_*,_std::allocator<CAMFImporter_NodeElement_Color_*>_>
                *)local_40._M_p;
          local_e0.ne_volume_color = (CAMFImporter_NodeElement_Color **)local_90;
          local_e0.pObjectColor = &local_38;
          local_e0.cur_mat = (SPP_Material **)&local_98;
          local_e0.pVertexCoordinateArray = pVertexCoordinateArray;
          p_Var15 = (_List_node_base *)operator_new(0x520);
          p_Var15->_M_next = (_List_node_base *)0x0;
          *(undefined4 *)&p_Var15->_M_prev = 0;
          local_118 = p_Var15 + 1;
          memset(local_118,0,0xcc);
          p_Var15[0xe]._M_next = (_List_node_base *)0x0;
          p_Var15[0xe]._M_prev = (_List_node_base *)0x0;
          *(undefined1 *)&p_Var15[0xf]._M_next = 0;
          memset((void *)((long)&p_Var15[0xf]._M_next + 1),0x1b,0x3ff);
          *(undefined4 *)&p_Var15[0x4f]._M_next = 0;
          p_Var15[0x4f]._M_prev = (_List_node_base *)0x0;
          p_Var15[0x50]._M_next = (_List_node_base *)0x0;
          p_Var15[0x50]._M_prev = (_List_node_base *)0x0;
          p_Var15[0x51]._M_next = (_List_node_base *)0x0;
          *(undefined4 *)&p_Var15[0x51]._M_prev = 0;
          p_Var15[7]._M_next = (_List_node_base *)0x0;
          p_Var15[7]._M_prev = (_List_node_base *)0x0;
          p_Var15[8]._M_next = (_List_node_base *)0x0;
          p_Var15[8]._M_prev = (_List_node_base *)0x0;
          p_Var15[9]._M_next = (_List_node_base *)0x0;
          p_Var15[9]._M_prev = (_List_node_base *)0x0;
          p_Var15[10]._M_next = (_List_node_base *)0x0;
          p_Var15[10]._M_prev = (_List_node_base *)0x0;
          p_Var15[0xb]._M_next = (_List_node_base *)0x0;
          p_Var15[0xb]._M_prev = (_List_node_base *)0x0;
          p_Var15[0xc]._M_next = (_List_node_base *)0x0;
          p_Var15[0xc]._M_prev = (_List_node_base *)0x0;
          p_Var15[3]._M_next = (_List_node_base *)0x0;
          p_Var15[3]._M_prev = (_List_node_base *)0x0;
          p_Var15[4]._M_next = (_List_node_base *)0x0;
          p_Var15[4]._M_prev = (_List_node_base *)0x0;
          p_Var15[5]._M_next = (_List_node_base *)0x0;
          p_Var15[5]._M_prev = (_List_node_base *)0x0;
          p_Var15[6]._M_next = (_List_node_base *)0x0;
          p_Var15[6]._M_prev = (_List_node_base *)0x0;
          *(undefined4 *)&p_Var15->_M_next = 4;
          p_Var20 = *(_List_node_base **)
                     ((long)&(((_List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
                                *)((long)local_128 + 0x18))->_M_impl)._M_node.super__List_node_base
                     + 8);
          *(int *)&p_Var15->_M_prev = (int)p_Var20;
          uVar28 = (ulong)p_Var20 & 0xffffffff;
          puVar16 = (ulong *)operator_new__(uVar28 * 0x10 + 8);
          *puVar16 = uVar28;
          p_Var17 = (_List_node_base *)(puVar16 + 1);
          if (uVar28 != 0) {
            p_Var23 = p_Var17;
            do {
              *(undefined4 *)&p_Var23->_M_next = 0;
              p_Var23->_M_prev = (_List_node_base *)0x0;
              p_Var23 = p_Var23 + 1;
            } while (p_Var23 != p_Var17 + uVar28);
          }
          p_Var15[0xd]._M_next = p_Var17;
          local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
          local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
          local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (aiColor4t<float> *)0x0;
          local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_finish = (aiColor4t<float> *)0x0;
          uVar28 = (long)p_Var20 * 6 & 0x1fffffffe;
          local_150 = p_Var15;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                    (&local_188,uVar28);
          std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve
                    (&local_168,uVar28);
          psVar1 = &(((_List_impl *)&local_128->_M_next)->_M_node)._M_size;
          plVar29 = (long *)*psVar1;
          paVar18 = (aiColor4t<float> *)(ulong)*(uint *)plVar29[3];
          for (; (size_t *)plVar29 != psVar1; plVar29 = (long *)*plVar29) {
            if ((ulong)*(uint *)(plVar29 + 2) != 0) {
              uVar31 = 0;
              paVar24 = paVar18;
              do {
                paVar18 = (aiColor4t<float> *)(ulong)*(uint *)(plVar29[3] + uVar31 * 4);
                if (paVar24 < paVar18) {
                  paVar18 = paVar24;
                }
                uVar31 = uVar31 + 1;
                paVar24 = paVar18;
              } while (*(uint *)(plVar29 + 2) != uVar31);
            }
          }
          paVar5 = (pVertexCoordinateArray->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          paVar24 = (aiColor4t<float> *)
                    (((long)(pVertexCoordinateArray->
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 2) *
                    -0x5555555555555555);
          if (paVar24 < paVar18 || (long)paVar24 - (long)paVar18 == 0) goto LAB_003f65e9;
          paVar2 = paVar5 + (long)paVar18;
          if (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>const&>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_188,
                       (iterator)
                       local_188.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,paVar2);
          }
          else {
            (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->z = paVar2->z;
            fVar9 = paVar2->y;
            (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->x = paVar2->x;
            (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->y = fVar9;
            local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_188.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_88 = Postprocess_BuildMeshSet::anon_class_40_5_b0e7ad54::operator()
                               (&local_e0,(size_t)paVar18);
          paVar24 = local_168.
                    super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
                    .super__Vector_impl_data._M_finish;
          if (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
            _M_realloc_insert<aiColor4t<float>>
                      ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&local_168,
                       (iterator)
                       local_168.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_88);
          }
          else {
            (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->r = local_88.r;
            (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->g = local_88.g;
            (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->b = local_88.b;
            (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->a = local_88.a;
            local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if (paVar18 != (aiColor4t<float> *)0x0) {
            for (plVar29 = (long *)*psVar1; (size_t *)plVar29 != psVar1; plVar29 = (long *)*plVar29)
            {
              if ((int)plVar29[2] != 0) {
                uVar31 = 0;
                do {
                  paVar24 = (aiColor4t<float> *)(ulong)*(uint *)(plVar29[3] + uVar31 * 4);
                  if (paVar18 == paVar24) {
                    *(undefined4 *)(plVar29[3] + uVar31 * 4) = 0;
                  }
                  uVar31 = uVar31 + 1;
                } while (uVar31 < *(uint *)(plVar29 + 2));
              }
            }
          }
          paVar27 = (aiColor4t<float> *)0x0;
LAB_003f5d2d:
          bVar13 = false;
          psVar25 = psVar1;
          do {
            psVar25 = (size_t *)*psVar25;
            if (psVar25 == psVar1) break;
            if ((ulong)*(uint *)(psVar25 + 2) != 0) {
              uVar31 = 0;
              do {
                paVar18 = (aiColor4t<float> *)(ulong)*(uint *)(psVar25[3] + uVar31 * 4);
                if (paVar27 < paVar18) {
                  bVar13 = true;
                  paVar24 = paVar18;
                  break;
                }
                uVar31 = uVar31 + 1;
              } while (*(uint *)(psVar25 + 2) != uVar31);
            }
          } while (!bVar13);
          paVar18 = paVar27;
          if (bVar13) {
            paVar18 = paVar24;
            for (plVar29 = (long *)*psVar1; (size_t *)plVar29 != psVar1; plVar29 = (long *)*plVar29)
            {
              if ((ulong)*(uint *)(plVar29 + 2) != 0) {
                uVar31 = 0;
                do {
                  paVar32 = (aiColor4t<float> *)(ulong)*(uint *)(plVar29[3] + uVar31 * 4);
                  paVar24 = paVar18;
                  if (paVar27 < paVar32) {
                    paVar24 = paVar32;
                  }
                  paVar33 = paVar32;
                  if (paVar18 < paVar32) {
                    paVar33 = paVar18;
                  }
                  bVar13 = paVar32 < paVar18;
                  paVar18 = paVar33;
                  if (bVar13) {
                    paVar18 = paVar24;
                  }
                  uVar31 = uVar31 + 1;
                } while (*(uint *)(plVar29 + 2) != uVar31);
              }
            }
          }
          if (paVar18 != paVar27) {
            paVar5 = (pVertexCoordinateArray->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            paVar24 = (aiColor4t<float> *)
                      (((long)(pVertexCoordinateArray->
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 2) *
                      -0x5555555555555555);
            if (paVar24 < paVar18 || (long)paVar24 - (long)paVar18 == 0) goto LAB_003f65e9;
            paVar2 = paVar5 + (long)paVar18;
            if (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
              _M_realloc_insert<aiVector3t<float>const&>
                        ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_188,
                         (iterator)
                         local_188.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish,paVar2);
            }
            else {
              (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->z = paVar2->z;
              fVar9 = paVar2->y;
              (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->x = paVar2->x;
              (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->y = fVar9;
              local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_188.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            local_88 = Postprocess_BuildMeshSet::anon_class_40_5_b0e7ad54::operator()
                                 (&local_e0,(size_t)paVar18);
            paVar24 = local_168.
                      super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
              _M_realloc_insert<aiColor4t<float>>
                        ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&local_168,
                         (iterator)
                         local_168.
                         super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_88);
            }
            else {
              (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->r = local_88.r;
              (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->g = local_88.g;
              (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->b = local_88.b;
              (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->a = local_88.a;
              local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_168.
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            paVar27 = (aiColor4t<float> *)((long)&paVar27->r + 1);
            if (paVar18 != paVar27) {
              for (plVar29 = (long *)*psVar1; (size_t *)plVar29 != psVar1;
                  plVar29 = (long *)*plVar29) {
                if ((int)plVar29[2] != 0) {
                  uVar31 = 0;
                  do {
                    paVar24 = (aiColor4t<float> *)(ulong)*(uint *)(plVar29[3] + uVar31 * 4);
                    if (paVar18 == paVar24) {
                      *(int *)(plVar29[3] + uVar31 * 4) = (int)paVar27;
                    }
                    uVar31 = uVar31 + 1;
                  } while (uVar31 < *(uint *)(plVar29 + 2));
                }
              }
            }
            goto LAB_003f5d2d;
          }
          for (plVar29 = (long *)*psVar1; (size_t *)plVar29 != psVar1; plVar29 = (long *)*plVar29) {
            lVar34 = plVar29[4];
            if (lVar34 != 0) {
              local_68 = (_Base_ptr)0x0;
              uStack_60 = (pointer)0x0;
              if (*(char *)(lVar34 + 0x50) == '\x01') goto LAB_003f65fa;
              local_68 = *(_Base_ptr *)(lVar34 + 0xd8);
              uStack_60 = *(pointer *)(lVar34 + 0xe0);
              if ((int)plVar29[2] != 0) {
                lVar34 = (long)local_188.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_188.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                paVar18 = (aiColor4t<float> *)0x0;
                do {
                  uVar31 = (ulong)*(uint *)(plVar29[3] + (long)paVar18 * 4);
                  uVar26 = ((long)local_188.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_188.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 2) *
                           -0x5555555555555555;
                  if (uVar26 < uVar31 || uVar26 - uVar31 == 0) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar31);
                    goto LAB_003f65d8;
                  }
                  paVar2 = local_188.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar31;
                  if (local_188.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_188.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                    _M_realloc_insert<aiVector3t<float>const&>
                              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                               &local_188,
                               (iterator)
                               local_188.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,paVar2);
                  }
                  else {
                    (local_188.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->z = paVar2->z;
                    fVar9 = paVar2->y;
                    (local_188.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->x = paVar2->x;
                    (local_188.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->y = fVar9;
                    local_188.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_188.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  if (local_168.
                      super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_168.
                      super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
                    _M_realloc_insert<aiColor4t<float>const&>
                              ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)
                               &local_168,
                               (iterator)
                               local_168.
                               super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                               (aiColor4t<float> *)&local_68);
                  }
                  else {
                    (local_168.
                     super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->r = (float)local_68;
                    (local_168.
                     super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->g = local_68._4_4_;
                    (local_168.
                     super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->b = (float)uStack_60;
                    (local_168.
                     super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->a = uStack_60._4_4_;
                    local_168.
                    super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
                    .super__Vector_impl_data._M_finish =
                         local_168.
                         super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  *(int *)(plVar29[3] + (long)paVar18 * 4) =
                       (int)(lVar34 >> 2) * -0x55555555 + (int)paVar18;
                  paVar18 = (aiColor4t<float> *)((long)&paVar18->r + 1);
                } while (paVar18 < (aiColor4t<float> *)(ulong)*(uint *)(plVar29 + 2));
              }
            }
          }
          if (*(long *)(*psVar1 + 0x28) != 0) {
            lVar34 = (long)local_188.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_188.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            __s = operator_new__(uVar28);
            if (uVar28 != 0) {
              memset(__s,0,uVar28);
            }
            lVar6 = *(long *)(*psVar1 + 0x28);
            sVar19 = PostprocessHelper_GetTextureID_Or_Create
                               (local_120,(string *)(lVar6 + 0x78),(string *)(lVar6 + 0x98),
                                (string *)(lVar6 + 0xb8),(string *)(lVar6 + 0xd8));
            *(int *)&local_150[0xe]._M_prev = (int)sVar19;
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                      (&local_148,uVar28);
            paVar24 = (aiColor4t<float> *)((lVar34 >> 2) * -0x5555555555555555);
            for (plVar29 = (long *)*psVar1; (size_t *)plVar29 != psVar1; plVar29 = (long *)*plVar29)
            {
              if ((int)plVar29[2] != 0) {
                lVar34 = 0;
                uVar28 = 0;
                do {
                  paVar18 = (aiColor4t<float> *)(ulong)*(uint *)(plVar29[3] + uVar28 * 4);
                  if (*(char *)((long)__s + (long)paVar18) == '\0') {
                    paVar27 = (aiColor4t<float> *)
                              (((long)local_148.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_148.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) *
                              -0x5555555555555555);
                    if (paVar27 < paVar18 || (long)paVar27 - (long)paVar18 == 0) goto LAB_003f65d8;
                    lVar6 = plVar29[5];
                    local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)paVar18].z =
                         *(float *)(lVar6 + 0x58 + lVar34);
                    uVar7 = *(undefined8 *)(lVar6 + 0x50 + lVar34);
                    local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)paVar18].x = (float)(int)uVar7;
                    local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)paVar18].y =
                         (float)(int)((ulong)uVar7 >> 0x20);
                    *(undefined1 *)((long)__s + (long)paVar18) = 1;
                  }
                  else {
                    paVar27 = (aiColor4t<float> *)
                              (((long)local_148.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_148.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) *
                              -0x5555555555555555);
                    if (paVar27 < paVar18 || (long)paVar27 - (long)paVar18 == 0) goto LAB_003f65d8;
                    lVar6 = plVar29[5];
                    pfVar3 = (float *)(lVar6 + 0x50 + lVar34);
                    if ((local_148.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[(long)paVar18].x == *pfVar3) &&
                       (!NAN(local_148.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(long)paVar18].x) &&
                        !NAN(*pfVar3))) {
                      pfVar3 = (float *)(lVar6 + 0x54 + lVar34);
                      if ((local_148.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)paVar18].y == *pfVar3) &&
                         (!NAN(local_148.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[(long)paVar18].y) &&
                          !NAN(*pfVar3))) {
                        pfVar3 = (float *)(lVar6 + 0x58 + lVar34);
                        if ((local_148.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(long)paVar18].z == *pfVar3)
                           && (!NAN(local_148.
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[(long)paVar18].z) &&
                               !NAN(*pfVar3))) goto LAB_003f6263;
                      }
                    }
                    paVar27 = (aiColor4t<float> *)
                              (((long)local_188.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_188.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) *
                              -0x5555555555555555);
                    if (paVar27 < paVar18 || (long)paVar27 - (long)paVar18 == 0) goto LAB_003f65d8;
                    paVar2 = local_188.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + (long)paVar18;
                    if (local_188.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_188.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                      _M_realloc_insert<aiVector3t<float>const&>
                                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                                 &local_188,
                                 (iterator)
                                 local_188.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,paVar2);
                    }
                    else {
                      (local_188.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->z = paVar2->z;
                      fVar9 = paVar2->y;
                      (local_188.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->x = paVar2->x;
                      (local_188.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->y = fVar9;
                      local_188.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_188.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    if ((aiColor4t<float> *)
                        ((long)local_168.
                               super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_168.
                               super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) <= paVar18)
                    goto LAB_003f65d8;
                    paVar18 = local_168.
                              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + (long)paVar18;
                    if (local_168.
                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_168.
                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
                      _M_realloc_insert<aiColor4t<float>const&>
                                ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)
                                 &local_168,
                                 (iterator)
                                 local_168.
                                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,paVar18);
                    }
                    else {
                      fVar9 = paVar18->g;
                      fVar10 = paVar18->b;
                      fVar11 = paVar18->a;
                      (local_168.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->r = paVar18->r;
                      (local_168.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->g = fVar9;
                      (local_168.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->b = fVar10;
                      (local_168.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->a = fVar11;
                      local_168.
                      super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_168.
                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                           _M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    paVar27 = (aiColor4t<float> *)
                              (((long)local_148.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_148.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) *
                              -0x5555555555555555);
                    paVar18 = paVar24;
                    if (paVar27 < paVar24 || (long)paVar27 - (long)paVar24 == 0) goto LAB_003f65d8;
                    lVar6 = plVar29[5];
                    local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)paVar24].z =
                         *(float *)(lVar6 + 0x58 + lVar34);
                    uVar7 = *(undefined8 *)(lVar6 + 0x50 + lVar34);
                    local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)paVar24].x = (float)(int)uVar7;
                    local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)paVar24].y =
                         (float)(int)((ulong)uVar7 >> 0x20);
                    *(int *)(plVar29[3] + uVar28 * 4) = (int)paVar24;
                    paVar24 = (aiColor4t<float> *)((long)&paVar24->r + 1);
                  }
LAB_003f6263:
                  uVar28 = uVar28 + 1;
                  lVar34 = lVar34 + 0xc;
                } while (uVar28 < *(uint *)(plVar29 + 2));
              }
            }
            operator_delete__(__s);
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                      (&local_148,(size_type)paVar24);
            pVertexCoordinateArray =
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_50._8_8_;
          }
          paVar5 = local_188.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          lVar34 = (long)local_188.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_188.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 0x3f;
          uVar28 = (((long)local_188.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_188.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 6 + lVar34 >> 1) - lVar34;
          iVar36 = (int)uVar28;
          *(int *)((long)&local_150->_M_next + 4) = iVar36;
          uVar28 = uVar28 & 0xffffffff;
          p_Var20 = (_List_node_base *)operator_new__(uVar28 * 0xc);
          if (iVar36 != 0) {
            memset(p_Var20,0,((uVar28 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          local_118->_M_next = p_Var20;
          p_Var15 = (_List_node_base *)operator_new__(uVar28 << 4);
          local_118 = p_Var20;
          if (iVar36 != 0) {
            memset(p_Var15,0,uVar28 << 4);
          }
          local_150[3]._M_next = p_Var15;
          uVar28 = (ulong)*(uint *)((long)&local_150->_M_next + 4);
          __n = uVar28 * 0xc;
          memcpy(local_118,paVar5,__n);
          memcpy(p_Var15,local_168.
                         super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start,uVar28 << 4);
          paVar5 = local_148.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            p_Var20 = (_List_node_base *)operator_new__(__n);
            if (uVar28 != 0) {
              memset(p_Var20,0,((uVar28 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            }
            p_Var15 = local_150;
            local_150[7]._M_next = p_Var20;
            memcpy(p_Var20,paVar5,__n);
            *(undefined4 *)&p_Var15[0xb]._M_next = 2;
          }
          p_Var20 = local_150;
          plVar29 = (long *)*psVar1;
          if ((size_t *)plVar29 != psVar1) {
            lVar34 = 0;
            do {
              aiFace::operator=((aiFace *)((long)&(p_Var20[0xd]._M_next)->_M_next + lVar34),
                                (aiFace *)(plVar29 + 2));
              plVar29 = (long *)*plVar29;
              lVar34 = lVar34 + 0x10;
            } while ((size_t *)plVar29 != psVar1);
          }
          sVar19 = (local_b8->super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl._M_node
                   ._M_size;
          p_Var15 = (_List_node_base *)operator_new(0x18);
          *(int *)&p_Var15[1]._M_next = (int)sVar19;
          std::__detail::_List_node_base::_M_hook(p_Var15);
          local_e8 = local_e8 + 1;
          p_Var15 = (_List_node_base *)operator_new(0x18);
          plVar12 = local_b8;
          p_Var15[1]._M_next = p_Var20;
          std::__detail::_List_node_base::_M_hook(p_Var15);
          psVar1 = &(plVar12->super__List_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl._M_node
                    ._M_size;
          *psVar1 = *psVar1 + 1;
          if (local_168.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_168.
                            super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_168.
                                  super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_168.
                                  super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_148.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_148.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_148.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_188.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_188.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_188.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_188.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        std::__cxx11::
        _List_base<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
        ::_M_clear(&local_110);
        this = (AMFImporter *)local_b0;
        std::__cxx11::
        _List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
        ::_M_clear((_List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                    *)this);
        p_Var20 = local_58;
      }
      p_Var20 = p_Var20->_M_next;
      uVar7 = local_50._8_8_;
    } while (p_Var20 != (_List_node_base *)local_50._M_allocated_capacity);
  }
  pppppppuVar35 = local_f8;
  if ((undefined8 ********)local_f8 != &local_f8) {
    pSceneNode->mNumMeshes = (uint)local_e8;
    puVar21 = (uint *)operator_new__((local_e8 & 0xffffffff) << 2);
    pSceneNode->mMeshes = puVar21;
    if (pSceneNode->mNumMeshes != 0) {
      uVar28 = 0;
      do {
        pppppppuVar8 = pppppppuVar35 + 2;
        pppppppuVar35 = (undefined8 *******)*pppppppuVar35;
        pSceneNode->mMeshes[uVar28] = *(uint *)pppppppuVar8;
        uVar28 = uVar28 + 1;
      } while (uVar28 < pSceneNode->mNumMeshes);
    }
  }
  pppppppuVar35 = local_f8;
  while ((undefined8 ********)pppppppuVar35 != &local_f8) {
    pppppppuVar8 = (undefined8 *******)*pppppppuVar35;
    operator_delete(pppppppuVar35,0x18);
    pppppppuVar35 = pppppppuVar8;
  }
  return;
LAB_003f65d8:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",paVar18);
LAB_003f65e9:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",paVar18);
LAB_003f65fa:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"IME: face color composed","")
  ;
  std::runtime_error::runtime_error(this_00,(string *)&local_88);
  *(undefined ***)this_00 = &PTR__runtime_error_0082bce0;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AMFImporter::Postprocess_BuildMeshSet(const CAMFImporter_NodeElement_Mesh& pNodeElement, const std::vector<aiVector3D>& pVertexCoordinateArray,
											const std::vector<CAMFImporter_NodeElement_Color*>& pVertexColorArray,
											const CAMFImporter_NodeElement_Color* pObjectColor, std::list<aiMesh*>& pMeshList, aiNode& pSceneNode)
{
std::list<unsigned int> mesh_idx;

	// all data stored in "volume", search for it.
	for(const CAMFImporter_NodeElement* ne_child: pNodeElement.Child)
	{
		const CAMFImporter_NodeElement_Color* ne_volume_color = nullptr;
		const SPP_Material* cur_mat = nullptr;

		if(ne_child->Type == CAMFImporter_NodeElement::ENET_Volume)
		{
			/******************* Get faces *******************/
			const CAMFImporter_NodeElement_Volume* ne_volume = reinterpret_cast<const CAMFImporter_NodeElement_Volume*>(ne_child);

			std::list<SComplexFace> complex_faces_list;// List of the faces of the volume.
			std::list<std::list<SComplexFace> > complex_faces_toplist;// List of the face list for every mesh.

			// check if volume use material
			if(!ne_volume->MaterialID.empty())
			{
				if(!Find_ConvertedMaterial(ne_volume->MaterialID, &cur_mat)) Throw_ID_NotFound(ne_volume->MaterialID);
			}

			// inside "volume" collect all data and place to arrays or create new objects
			for(const CAMFImporter_NodeElement* ne_volume_child: ne_volume->Child)
			{
				// color for volume
				if(ne_volume_child->Type == CAMFImporter_NodeElement::ENET_Color)
				{
					ne_volume_color = reinterpret_cast<const CAMFImporter_NodeElement_Color*>(ne_volume_child);
				}
				else if(ne_volume_child->Type == CAMFImporter_NodeElement::ENET_Triangle)// triangles, triangles colors
				{
					const CAMFImporter_NodeElement_Triangle& tri_al = *reinterpret_cast<const CAMFImporter_NodeElement_Triangle*>(ne_volume_child);

					SComplexFace complex_face;

					// initialize pointers
					complex_face.Color = nullptr;
					complex_face.TexMap = nullptr;
					// get data from triangle children: color, texture coordinates.
					if(tri_al.Child.size())
					{
						for(const CAMFImporter_NodeElement* ne_triangle_child: tri_al.Child)
						{
							if(ne_triangle_child->Type == CAMFImporter_NodeElement::ENET_Color)
								complex_face.Color = reinterpret_cast<const CAMFImporter_NodeElement_Color*>(ne_triangle_child);
							else if(ne_triangle_child->Type == CAMFImporter_NodeElement::ENET_TexMap)
								complex_face.TexMap = reinterpret_cast<const CAMFImporter_NodeElement_TexMap*>(ne_triangle_child);
						}
					}// if(tri_al.Child.size())

					// create new face and store it.
					complex_face.Face.mNumIndices = 3;
					complex_face.Face.mIndices = new unsigned int[3];
					complex_face.Face.mIndices[0] = static_cast<unsigned int>(tri_al.V[0]);
					complex_face.Face.mIndices[1] = static_cast<unsigned int>(tri_al.V[1]);
					complex_face.Face.mIndices[2] = static_cast<unsigned int>(tri_al.V[2]);
					complex_faces_list.push_back(complex_face);
				}
			}// for(const CAMFImporter_NodeElement* ne_volume_child: ne_volume->Child)

			/**** Split faces list: one list per mesh ****/
			PostprocessHelper_SplitFacesByTextureID(complex_faces_list, complex_faces_toplist);

			/***** Create mesh for every faces list ******/
			for(std::list<SComplexFace>& face_list_cur: complex_faces_toplist)
			{
				auto VertexIndex_GetMinimal = [](const std::list<SComplexFace>& pFaceList, const size_t* pBiggerThan) -> size_t
				{
					size_t rv;

					if(pBiggerThan != nullptr)
					{
						bool found = false;

						for(const SComplexFace& face: pFaceList)
						{
							for(size_t idx_vert = 0; idx_vert < face.Face.mNumIndices; idx_vert++)
							{
								if(face.Face.mIndices[idx_vert] > *pBiggerThan)
								{
									rv = face.Face.mIndices[idx_vert];
									found = true;

									break;
								}
							}

							if(found) break;
						}

						if(!found) return *pBiggerThan;
					}
					else
					{
						rv = pFaceList.front().Face.mIndices[0];
					}// if(pBiggerThan != nullptr) else

					for(const SComplexFace& face: pFaceList)
					{
						for(size_t vi = 0; vi < face.Face.mNumIndices; vi++)
						{
							if(face.Face.mIndices[vi] < rv)
							{
								if(pBiggerThan != nullptr)
								{
									if(face.Face.mIndices[vi] > *pBiggerThan) rv = face.Face.mIndices[vi];
								}
								else
								{
									rv = face.Face.mIndices[vi];
								}
							}
						}
					}// for(const SComplexFace& face: pFaceList)

					return rv;
				};// auto VertexIndex_GetMinimal = [](const std::list<SComplexFace>& pFaceList, const size_t* pBiggerThan) -> size_t

				auto VertexIndex_Replace = [](std::list<SComplexFace>& pFaceList, const size_t pIdx_From, const size_t pIdx_To) -> void
				{
					for(const SComplexFace& face: pFaceList)
					{
						for(size_t vi = 0; vi < face.Face.mNumIndices; vi++)
						{
							if(face.Face.mIndices[vi] == pIdx_From) face.Face.mIndices[vi] = static_cast<unsigned int>(pIdx_To);
						}
					}
				};// auto VertexIndex_Replace = [](std::list<SComplexFace>& pFaceList, const size_t pIdx_From, const size_t pIdx_To) -> void

				auto Vertex_CalculateColor = [&](const size_t pIdx) -> aiColor4D
				{
					// Color priorities(In descending order):
					// 1. triangle color;
					// 2. vertex color;
					// 3. volume color;
					// 4. object color;
					// 5. material;
					// 6. default - invisible coat.
					//
					// Fill vertices colors in color priority list above that's points from 1 to 6.
					if((pIdx < pVertexColorArray.size()) && (pVertexColorArray[pIdx] != nullptr))// check for vertex color
					{
						if(pVertexColorArray[pIdx]->Composed)
							throw DeadlyImportError("IME: vertex color composed");
						else
							return pVertexColorArray[pIdx]->Color;
					}
					else if(ne_volume_color != nullptr)// check for volume color
					{
						if(ne_volume_color->Composed)
							throw DeadlyImportError("IME: volume color composed");
						else
							return ne_volume_color->Color;
					}
					else if(pObjectColor != nullptr)// check for object color
					{
						if(pObjectColor->Composed)
							throw DeadlyImportError("IME: object color composed");
						else
							return pObjectColor->Color;
					}
					else if(cur_mat != nullptr)// check for material
					{
						return cur_mat->GetColor(pVertexCoordinateArray.at(pIdx).x, pVertexCoordinateArray.at(pIdx).y, pVertexCoordinateArray.at(pIdx).z);
					}
					else// set default color.
					{
						return {0, 0, 0, 0};
					}// if((vi < pVertexColorArray.size()) && (pVertexColorArray[vi] != nullptr)) else

				};// auto Vertex_CalculateColor = [&](const size_t pIdx) -> aiColor4D

				aiMesh* tmesh = new aiMesh;

				tmesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;// Only triangles is supported by AMF.
				//
				// set geometry and colors (vertices)
				//
				// copy faces/triangles
				tmesh->mNumFaces = static_cast<unsigned int>(face_list_cur.size());
				tmesh->mFaces = new aiFace[tmesh->mNumFaces];

				// Create vertices list and optimize indices. Optimisation mean following.In AMF all volumes use one big list of vertices. And one volume
				// can use only part of vertices list, for example: vertices list contain few thousands of vertices and volume use vertices 1, 3, 10.
				// Do you need all this thousands of garbage? Of course no. So, optimisation step transformate sparse indices set to continuous.
				size_t VertexCount_Max = tmesh->mNumFaces * 3;// 3 - triangles.
				std::vector<aiVector3D> vert_arr, texcoord_arr;
				std::vector<aiColor4D> col_arr;

				vert_arr.reserve(VertexCount_Max * 2);// "* 2" - see below TODO.
				col_arr.reserve(VertexCount_Max * 2);

				{// fill arrays
					size_t vert_idx_from, vert_idx_to;

					// first iteration.
					vert_idx_to = 0;
					vert_idx_from = VertexIndex_GetMinimal(face_list_cur, nullptr);
					vert_arr.push_back(pVertexCoordinateArray.at(vert_idx_from));
					col_arr.push_back(Vertex_CalculateColor(vert_idx_from));
					if(vert_idx_from != vert_idx_to) VertexIndex_Replace(face_list_cur, vert_idx_from, vert_idx_to);

					// rest iterations
					do
					{
						vert_idx_from = VertexIndex_GetMinimal(face_list_cur, &vert_idx_to);
						if(vert_idx_from == vert_idx_to) break;// all indices are transferred,

						vert_arr.push_back(pVertexCoordinateArray.at(vert_idx_from));
						col_arr.push_back(Vertex_CalculateColor(vert_idx_from));
						vert_idx_to++;
						if(vert_idx_from != vert_idx_to) VertexIndex_Replace(face_list_cur, vert_idx_from, vert_idx_to);

					} while(true);
				}// fill arrays. END.

				//
				// check if triangle colors are used and create additional faces if needed.
				//
				for(const SComplexFace& face_cur: face_list_cur)
				{
					if(face_cur.Color != nullptr)
					{
						aiColor4D face_color;
						size_t vert_idx_new = vert_arr.size();

						if(face_cur.Color->Composed)
							throw DeadlyImportError("IME: face color composed");
						else
							face_color = face_cur.Color->Color;

						for(size_t idx_ind = 0; idx_ind < face_cur.Face.mNumIndices; idx_ind++)
						{
							vert_arr.push_back(vert_arr.at(face_cur.Face.mIndices[idx_ind]));
							col_arr.push_back(face_color);
							face_cur.Face.mIndices[idx_ind] = static_cast<unsigned int>(vert_idx_new++);
						}
					}// if(face_cur.Color != nullptr)
				}// for(const SComplexFace& face_cur: face_list_cur)

				//
				// if texture is used then copy texture coordinates too.
				//
				if(face_list_cur.front().TexMap != nullptr)
				{
					size_t idx_vert_new = vert_arr.size();
					///TODO: clean unused vertices. "* 2": in certain cases - mesh full of triangle colors - vert_arr will contain duplicated vertices for
					/// colored triangles and initial vertices (for colored vertices) which in real became unused. This part need more thinking about
					/// optimisation.
					bool* idx_vert_used;

					idx_vert_used = new bool[VertexCount_Max * 2];
					for(size_t i = 0, i_e = VertexCount_Max * 2; i < i_e; i++) idx_vert_used[i] = false;

					// This ID's will be used when set materials ID in scene.
					tmesh->mMaterialIndex = static_cast<unsigned int>(PostprocessHelper_GetTextureID_Or_Create(face_list_cur.front().TexMap->TextureID_R,
																						face_list_cur.front().TexMap->TextureID_G,
																						face_list_cur.front().TexMap->TextureID_B,
																						face_list_cur.front().TexMap->TextureID_A));
					texcoord_arr.resize(VertexCount_Max * 2);
					for(const SComplexFace& face_cur: face_list_cur)
					{
						for(size_t idx_ind = 0; idx_ind < face_cur.Face.mNumIndices; idx_ind++)
						{
							const size_t idx_vert = face_cur.Face.mIndices[idx_ind];

							if(!idx_vert_used[idx_vert])
							{
								texcoord_arr.at(idx_vert) = face_cur.TexMap->TextureCoordinate[idx_ind];
								idx_vert_used[idx_vert] = true;
							}
							else if(texcoord_arr.at(idx_vert) != face_cur.TexMap->TextureCoordinate[idx_ind])
							{
								// in that case one vertex is shared with many texture coordinates. We need to duplicate vertex with another texture
								// coordinates.
								vert_arr.push_back(vert_arr.at(idx_vert));
								col_arr.push_back(col_arr.at(idx_vert));
								texcoord_arr.at(idx_vert_new) = face_cur.TexMap->TextureCoordinate[idx_ind];
								face_cur.Face.mIndices[idx_ind] = static_cast<unsigned int>(idx_vert_new++);
							}
						}// for(size_t idx_ind = 0; idx_ind < face_cur.Face.mNumIndices; idx_ind++)
					}// for(const SComplexFace& face_cur: face_list_cur)

					delete [] idx_vert_used;
					// shrink array
					texcoord_arr.resize(idx_vert_new);
				}// if(face_list_cur.front().TexMap != nullptr)

				//
				// copy collected data to mesh
				//
				tmesh->mNumVertices = static_cast<unsigned int>(vert_arr.size());
				tmesh->mVertices = new aiVector3D[tmesh->mNumVertices];
				tmesh->mColors[0] = new aiColor4D[tmesh->mNumVertices];

				memcpy(tmesh->mVertices, vert_arr.data(), tmesh->mNumVertices * sizeof(aiVector3D));
				memcpy(tmesh->mColors[0], col_arr.data(), tmesh->mNumVertices * sizeof(aiColor4D));
				if(texcoord_arr.size() > 0)
				{
					tmesh->mTextureCoords[0] = new aiVector3D[tmesh->mNumVertices];
					memcpy(tmesh->mTextureCoords[0], texcoord_arr.data(), tmesh->mNumVertices * sizeof(aiVector3D));
					tmesh->mNumUVComponents[0] = 2;// U and V stored in "x", "y" of aiVector3D.
				}

				size_t idx_face = 0;
				for(const SComplexFace& face_cur: face_list_cur) tmesh->mFaces[idx_face++] = face_cur.Face;

				// store new aiMesh
				mesh_idx.push_back(static_cast<unsigned int>(pMeshList.size()));
				pMeshList.push_back(tmesh);
			}// for(const std::list<SComplexFace>& face_list_cur: complex_faces_toplist)
		}// if(ne_child->Type == CAMFImporter_NodeElement::ENET_Volume)
	}// for(const CAMFImporter_NodeElement* ne_child: pNodeElement.Child)

	// if meshes was created then assign new indices with current aiNode
	if(!mesh_idx.empty())
	{
		std::list<unsigned int>::const_iterator mit = mesh_idx.begin();

		pSceneNode.mNumMeshes = static_cast<unsigned int>(mesh_idx.size());
		pSceneNode.mMeshes = new unsigned int[pSceneNode.mNumMeshes];
		for(size_t i = 0; i < pSceneNode.mNumMeshes; i++) pSceneNode.mMeshes[i] = *mit++;
	}// if(mesh_idx.size() > 0)
}